

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

bool anon_unknown.dwarf_13feb99::needToQuoteTestName(cmMakefile *mf,string *name)

{
  PolicyStatus PVar1;
  bool bVar2;
  undefined1 auVar3 [12];
  string sStack_b8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  bVar2 = false;
  PVar1 = cmMakefile::GetPolicyStatus(mf,CMP0110,false);
  if (PVar1 != OLD) {
    if (PVar1 == WARN) {
      bVar2 = false;
      auVar3 = std::__cxx11::string::find_first_of((char *)name,0x5aef50);
      if (auVar3._0_8_ != -1) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_98,(cmPolicies *)0x6e,auVar3._8_4_);
        local_48.View_._M_len = local_98._M_string_length;
        local_48.View_._M_str = local_98._M_dataplus._M_p;
        local_78.View_._M_len = 0x5b;
        local_78.View_._M_str =
             "\nThe following name given to add_test() is invalid if CMP0110 is not set or set to OLD:\n  `"
        ;
        cmStrCat<std::__cxx11::string,char[4]>
                  (&sStack_b8,&local_48,&local_78,name,&anon_var_dwarf_13f9382);
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&sStack_b8);
        std::__cxx11::string::~string((string *)&sStack_b8);
        std::__cxx11::string::~string((string *)&local_98);
        bVar2 = false;
      }
    }
    else {
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool needToQuoteTestName(const cmMakefile& mf, const std::string& name)
{
  // Determine if policy CMP0110 is set to NEW.
  switch (mf.GetPolicyStatus(cmPolicies::CMP0110)) {
    case cmPolicies::WARN:
      // Only warn if a forbidden character is used in the name.
      if (name.find_first_of("$[] #;\t\n\"\\") != std::string::npos) {
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0110),
                   "\nThe following name given to add_test() is invalid if "
                   "CMP0110 is not set or set to OLD:\n  `",
                   name, "´\n"));
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // OLD behavior is to not quote the test's name.
      return false;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
    default:
      // NEW behavior is to quote the test's name.
      return true;
  }
}